

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int ecjpake_write_len_point(uchar **p,uchar *end,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *P)

{
  uint uVar1;
  size_t local_48;
  size_t len;
  mbedtls_ecp_point *pmStack_38;
  int ret;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_group *pmStack_28;
  int pf_local;
  mbedtls_ecp_group *grp_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  if ((end < *p) || ((long)end - (long)*p < 5)) {
    p_local._4_4_ = -0x4f00;
  }
  else {
    pmStack_38 = P;
    P_local._4_4_ = pf;
    pmStack_28 = grp;
    grp_local = (mbedtls_ecp_group *)end;
    end_local = (uchar *)p;
    len._4_4_ = mbedtls_ecp_point_write_binary(grp,P,pf,&local_48,*p + 4,(long)end - (long)(*p + 4))
    ;
    p_local._4_4_ = len._4_4_;
    if (len._4_4_ == 0) {
      uVar1 = (uint)local_48;
      mbedtls_put_unaligned_uint32
                (*(void **)end_local,
                 uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
      *(size_t *)end_local = local_48 + 4 + *(long *)end_local;
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int ecjpake_write_len_point(unsigned char **p,
                                   const unsigned char *end,
                                   const mbedtls_ecp_group *grp,
                                   const int pf,
                                   const mbedtls_ecp_point *P)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    /* Need at least 4 for length plus 1 for point */
    if (end < *p || end - *p < 5) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    ret = mbedtls_ecp_point_write_binary(grp, P, pf,
                                         &len, *p + 4, end - (*p + 4));
    if (ret != 0) {
        return ret;
    }

    MBEDTLS_PUT_UINT32_BE(len, *p, 0);

    *p += 4 + len;

    return 0;
}